

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

uchar * format_from_rgba(uint32_t *data,uint pixels,format_t format)

{
  size_t __size;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uchar *puVar8;
  FILE *pFVar9;
  void *pvVar10;
  png_bytepp image;
  undefined4 extraout_var;
  uchar *extraout_RAX;
  ulong uVar11;
  undefined1 *puVar12;
  uint extraout_EDX;
  uint32_t *unaff_RBX;
  uchar *data8;
  long *plVar13;
  ulong uVar14;
  long *__filename;
  png_image *__filename_00;
  uint uVar15;
  int iVar16;
  png_image *ppVar17;
  png_const_structrp ppStack_108;
  png_inforp ppStack_100;
  long *plStack_f8;
  undefined1 *puStack_f0;
  png_image pStack_c8;
  void *pvStack_60;
  undefined1 *puStack_58;
  long *plStack_50;
  code *pcStack_48;
  uint32_t *puStack_40;
  
  uVar11 = (ulong)pixels;
  if (format + FORMAT_BGRA8888 < 9) {
    uVar14 = (ulong)pixels;
    unaff_RBX = data;
    switch(format) {
    default:
      goto switchD_00108862_caseD_0;
    case FORMAT_BGRA8888:
      puVar8 = (uchar *)malloc(uVar14 * 4);
      if (pixels != 0) {
        uVar11 = 0;
        do {
          puVar8[uVar11 * 4] = *(uchar *)((long)data + uVar11 * 4 + 2);
          puVar8[uVar11 * 4 + 1] = *(uchar *)((long)data + uVar11 * 4 + 1);
          puVar8[uVar11 * 4 + 2] = (uchar)data[uVar11];
          puVar8[uVar11 * 4 + 3] = *(uchar *)((long)data + uVar11 * 4 + 3);
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      break;
    case FORMAT_RGB565:
      puVar8 = (uchar *)malloc(uVar14 * 2);
      if (pixels != 0) {
        uVar11 = 0;
        do {
          uVar15 = data[uVar11];
          *(ushort *)(puVar8 + uVar11 * 2) =
               (ushort)(uVar15 >> 0x13) & 0x1f |
               (ushort)(uVar15 >> 5) & 0x7e0 | (ushort)((uVar15 & 0xf8) << 8);
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      break;
    case FORMAT_ARGB4444:
      puVar8 = (uchar *)malloc(uVar14 * 2);
      if (pixels != 0) {
        uVar11 = 0;
        do {
          uVar15 = data[uVar11];
          puVar8[uVar11 * 2] =
               (byte)(((uVar15 >> 8 & 0xff) + 8) / 0x11 << 4) |
               (byte)(((uVar15 >> 0x10 & 0xff) + 8) / 0x11);
          puVar8[uVar11 * 2 + 1] =
               (byte)(((uVar15 >> 0x18) + 8) / 0x11 << 4) | (byte)(((uVar15 & 0xff) + 8) / 0x11);
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      break;
    case FORMAT_GRAY8:
      puVar8 = (uchar *)malloc(uVar14);
      if (pixels != 0) {
        uVar11 = 0;
        do {
          puVar8[uVar11] = (uchar)data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      break;
    case 0xffffffff:
      pvVar10 = malloc(uVar14 << 2);
      puVar8 = (uchar *)memcpy(pvVar10,data,uVar14 << 2);
      return puVar8;
    }
    return puVar8;
  }
switchD_00108862_caseD_0:
  pvVar10 = (void *)(ulong)format;
  format_from_rgba_cold_1();
  iVar7 = (int)uVar11;
  ppVar17 = (png_image *)(uVar11 & 0xffffffff);
  __size = (long)ppVar17 * 4;
  pcStack_48 = (code *)0x1089f4;
  puStack_40 = unaff_RBX;
  puVar8 = (uchar *)malloc(__size);
  switch(extraout_EDX) {
  default:
    pcStack_48 = png_read;
    __filename = (long *)(ulong)extraout_EDX;
    format_to_rgba_cold_1();
    __filename_00 = &pStack_c8;
    pStack_c8.opaque = (png_controlp)0x0;
    pStack_c8.message[0x2c] = '\0';
    pStack_c8.message[0x2d] = '\0';
    pStack_c8.message[0x2e] = '\0';
    pStack_c8.message[0x2f] = '\0';
    pStack_c8.message[0x30] = '\0';
    pStack_c8.message[0x31] = '\0';
    pStack_c8.message[0x32] = '\0';
    pStack_c8.message[0x33] = '\0';
    pStack_c8.message[0x34] = '\0';
    pStack_c8.message[0x35] = '\0';
    pStack_c8.message[0x36] = '\0';
    pStack_c8.message[0x37] = '\0';
    pStack_c8.message[0x38] = '\0';
    pStack_c8.message[0x39] = '\0';
    pStack_c8.message[0x3a] = '\0';
    pStack_c8.message[0x3b] = '\0';
    pStack_c8.message[0x1c] = '\0';
    pStack_c8.message[0x1d] = '\0';
    pStack_c8.message[0x1e] = '\0';
    pStack_c8.message[0x1f] = '\0';
    pStack_c8.message[0x20] = '\0';
    pStack_c8.message[0x21] = '\0';
    pStack_c8.message[0x22] = '\0';
    pStack_c8.message[0x23] = '\0';
    pStack_c8.message[0x24] = '\0';
    pStack_c8.message[0x25] = '\0';
    pStack_c8.message[0x26] = '\0';
    pStack_c8.message[0x27] = '\0';
    pStack_c8.message[0x28] = '\0';
    pStack_c8.message[0x29] = '\0';
    pStack_c8.message[0x2a] = '\0';
    pStack_c8.message[0x2b] = '\0';
    pStack_c8.message[0xc] = '\0';
    pStack_c8.message[0xd] = '\0';
    pStack_c8.message[0xe] = '\0';
    pStack_c8.message[0xf] = '\0';
    pStack_c8.message[0x10] = '\0';
    pStack_c8.message[0x11] = '\0';
    pStack_c8.message[0x12] = '\0';
    pStack_c8.message[0x13] = '\0';
    pStack_c8.message[0x14] = '\0';
    pStack_c8.message[0x15] = '\0';
    pStack_c8.message[0x16] = '\0';
    pStack_c8.message[0x17] = '\0';
    pStack_c8.message[0x18] = '\0';
    pStack_c8.message[0x19] = '\0';
    pStack_c8.message[0x1a] = '\0';
    pStack_c8.message[0x1b] = '\0';
    pStack_c8.warning_or_error = 0;
    pStack_c8.message[0] = '\0';
    pStack_c8.message[1] = '\0';
    pStack_c8.message[2] = '\0';
    pStack_c8.message[3] = '\0';
    pStack_c8.message[4] = '\0';
    pStack_c8.message[5] = '\0';
    pStack_c8.message[6] = '\0';
    pStack_c8.message[7] = '\0';
    pStack_c8.message[8] = '\0';
    pStack_c8.message[9] = '\0';
    pStack_c8.message[10] = '\0';
    pStack_c8.message[0xb] = '\0';
    pStack_c8.height = 0;
    pStack_c8.format = 0;
    pStack_c8.flags = 0;
    pStack_c8.colormap_entries = 0;
    pStack_c8.message[0x3c] = '\0';
    pStack_c8.message[0x3d] = '\0';
    pStack_c8.message[0x3e] = '\0';
    pStack_c8.message[0x3f] = '\0';
    pStack_c8._100_4_ = 0;
    pStack_c8.version = 1;
    pStack_c8.width = 0;
    pvStack_60 = pvVar10;
    puStack_58 = (undefined1 *)ppVar17;
    plStack_50 = (long *)(ulong)extraout_EDX;
    pcStack_48 = (code *)__size;
    pFVar9 = fopen((char *)__filename,"rb");
    if (pFVar9 == (FILE *)0x0) {
      png_read_cold_3();
    }
    else {
      png_image_begin_read_from_stdio(&pStack_c8,(FILE *)pFVar9);
      if ((pStack_c8._32_8_ & 2) == 0) {
        pStack_c8.format = 3;
        puVar8 = (uchar *)malloc(0x18);
        *(png_uint_32 *)(puVar8 + 8) = pStack_c8.width;
        *(png_uint_32 *)(puVar8 + 0xc) = pStack_c8.height;
        puVar8[0x10] = 0xff;
        puVar8[0x11] = 0xff;
        puVar8[0x12] = 0xff;
        puVar8[0x13] = 0xff;
        pvVar10 = malloc((ulong)(pStack_c8.width * pStack_c8.height * 4));
        *(void **)puVar8 = pvVar10;
        png_image_finish_read(&pStack_c8,(png_const_colorp)0x0,pvVar10,0,(void *)0x0);
        ppVar17 = &pStack_c8;
        if ((pStack_c8._32_8_ & 2) == 0) {
          fclose(pFVar9);
          return puVar8;
        }
        goto LAB_00108c6d;
      }
    }
    png_read_cold_1();
LAB_00108c6d:
    plVar13 = __filename;
    png_read_cold_2();
    plStack_f8 = __filename;
    puStack_f0 = (undefined1 *)ppVar17;
    pFVar9 = fopen((char *)__filename_00,"wb");
    if (pFVar9 == (FILE *)0x0) {
      png_write_cold_1();
      puVar8 = extraout_RAX;
    }
    else {
      lVar5 = plVar13[2];
      iVar16 = 0;
      iVar7 = 6;
      if ((int)lVar5 == 7) {
        iVar7 = 0;
      }
      ppStack_108 = png_create_write_struct
                              ("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0);
      png_set_compression_level(ppStack_108,1);
      ppStack_100 = png_create_info_struct(ppStack_108);
      png_init_io(ppStack_108,(png_FILE_p)pFVar9);
      png_set_IHDR(ppStack_108,ppStack_100,*(png_uint_32 *)(plVar13 + 1),
                   *(png_uint_32 *)((long)plVar13 + 0xc),8,iVar7,0,0,0);
      png_write_info(ppStack_108,ppStack_100);
      uVar11 = (ulong)*(uint *)((long)plVar13 + 0xc);
      image = (png_bytepp)malloc(uVar11 * 8);
      if (uVar11 != 0) {
        lVar4 = *plVar13;
        lVar6 = plVar13[1];
        uVar14 = 0;
        do {
          image[uVar14] = (png_byte *)((ulong)(uint)(iVar16 << ((int)lVar5 != 7) * '\x02') + lVar4);
          uVar14 = uVar14 + 1;
          iVar16 = iVar16 + (int)lVar6;
        } while (uVar11 != uVar14);
      }
      png_write_image(ppStack_108,image);
      free(image);
      png_write_end(ppStack_108,ppStack_100);
      png_destroy_write_struct(&ppStack_108,&ppStack_100);
      iVar7 = fclose(pFVar9);
      puVar8 = (uchar *)CONCAT44(extraout_var,iVar7);
    }
    return puVar8;
  case 1:
    if (iVar7 != 0) {
      puVar12 = (undefined1 *)0x0;
      do {
        puVar8[(long)puVar12 * 4] = *(uchar *)((long)pvVar10 + (long)puVar12 * 4 + 2);
        puVar8[(long)puVar12 * 4 + 1] = *(uchar *)((long)pvVar10 + (long)puVar12 * 4 + 1);
        puVar8[(long)puVar12 * 4 + 2] = *(uchar *)((long)pvVar10 + (long)puVar12 * 4);
        puVar8[(long)puVar12 * 4 + 3] = *(uchar *)((long)pvVar10 + (long)puVar12 * 4 + 3);
        puVar12 = puVar12 + 1;
      } while (ppVar17 != (png_image *)puVar12);
    }
    break;
  case 3:
    if (iVar7 != 0) {
      puVar12 = (undefined1 *)0x0;
      do {
        uVar3 = *(ushort *)((long)pvVar10 + (long)puVar12 * 2);
        uVar15 = uVar3 & 0x20;
        *(uint *)(puVar8 + (long)puVar12 * 4) =
             uVar3 >> 0xb & 1 | uVar3 >> 10 & 2 |
             uVar3 >> 9 & 4 |
             (uVar15 << 4 | (uVar3 & 0x7e0) << 5 | (uVar3 & 1) << 0x10 | (uint)uVar3 << 0x13) +
             uVar15 * 8 + (uint)(uVar3 >> 0xb) * 8 | 0xff000000;
        puVar12 = puVar12 + 1;
      } while (ppVar17 != (png_image *)puVar12);
    }
    break;
  case 5:
    if (iVar7 != 0) {
      puVar12 = (undefined1 *)0x0;
      do {
        bVar1 = *(byte *)((long)pvVar10 + (long)puVar12 * 2 + 1);
        bVar2 = *(byte *)((long)pvVar10 + (long)puVar12 * 2);
        uVar15 = bVar2 & 0xf;
        *(uint *)(puVar8 + (long)puVar12 * 4) =
             ((uint)bVar1 << 0x14 | (uint)bVar1) & 0xf00000f | (bVar1 & 0xfffffff0) << 0x18 |
             (bVar1 & 0xf) << 4 | uVar15 << 0x14 | uVar15 << 0x10 | (bVar2 & 0xf0) << 8 |
             (bVar2 & 0xf0) << 4;
        puVar12 = puVar12 + 1;
      } while (ppVar17 != (png_image *)puVar12);
    }
    break;
  case 7:
    if (iVar7 != 0) {
      puVar12 = (undefined1 *)0x0;
      do {
        *(uint *)(puVar8 + (long)puVar12 * 4) =
             (uint)*(byte *)((long)pvVar10 + (long)puVar12) * 0x10101 | 0xff000000;
        puVar12 = puVar12 + 1;
      } while (ppVar17 != (png_image *)puVar12);
    }
    break;
  case 0xffffffff:
    puVar8 = (uchar *)memcpy(puVar8,pvVar10,__size);
    return puVar8;
  }
  return puVar8;
}

Assistant:

unsigned char*
format_from_rgba(
    const uint32_t* data,
    unsigned int pixels,
    format_t format)
{
    unsigned int i;
    unsigned char* out = NULL;

    if (format == FORMAT_GRAY8) {
        out = malloc(pixels);
        for (i = 0; i < pixels; ++i) {
            out[i] = data[i] & 0xff;
        }
    } else if (format == FORMAT_BGRA8888) {
        const unsigned char* data8 = (const unsigned char*)data;
        out = malloc(sizeof(uint32_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            out[i * sizeof(uint32_t) + 0] = data8[i * sizeof(uint32_t) + 2];
            out[i * sizeof(uint32_t) + 1] = data8[i * sizeof(uint32_t) + 1];
            out[i * sizeof(uint32_t) + 2] = data8[i * sizeof(uint32_t) + 0];
            out[i * sizeof(uint32_t) + 3] = data8[i * sizeof(uint32_t) + 3];
        }
    } else if (format == FORMAT_ARGB4444) {
        out = malloc(sizeof(uint16_t) * pixels);
        for (i = 0; i < pixels; ++i) {
            /* Use the extra precision for rounding. */
            const unsigned char r = (((data[i] & 0xff000000) >> 24) + 8) / 17;
            const unsigned char g = (((data[i] &   0xff0000) >> 16) + 8) / 17;
            const unsigned char b = (((data[i] &     0xff00) >>  8) + 8) / 17;
            const unsigned char a = (((data[i] &       0xff)      ) + 8) / 17;

            out[i * sizeof(uint16_t) + 0] = (b << 4) | g;
            out[i * sizeof(uint16_t) + 1] = (r << 4) | a;
        }
    } else if (format == FORMAT_RGB565) {
        uint16_t* out16;
        out = malloc(sizeof(uint16_t) * pixels);
        out16 = (uint16_t*)out;
        for (i = 0; i < pixels; ++i) {
                     /* 00000000 00000000 11111000 -> 00000000 00011111 */
            out16[i] = ((data[i] &     0xf8) << 8)
                     /* 00000000 11111100 00000000 -> 00000111 11100000 */
                     | ((data[i] &   0xfc00) >> 5)
                     /* 11111000 00000000 00000000 -> 11111000 00000000 */
                     | ((data[i] & 0xf80000) >>19);
        }
    } else if (format == FORMAT_RGBA8888) {
        out = malloc(sizeof(uint32_t) * pixels);
        memcpy(out, data, sizeof(uint32_t) * pixels);
    } else {
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        abort();
    }

    return out;
}